

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O2

KeyData * __thiscall
cfd::core::HDWallet::GeneratePubkeyData
          (KeyData *__return_storage_ptr__,HDWallet *this,NetType network_type,string *string_path)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_1a8;
  ByteData fingerprint;
  ExtPubkey local_178;
  ExtPrivkey key;
  ExtPrivkey privkey;
  
  ExtPrivkey::ExtPrivkey(&privkey,&this->seed_,network_type);
  ExtPrivkey::DerivePrivkey(&key,&privkey,string_path);
  Privkey::Privkey((Privkey *)&local_178,&privkey.privkey_);
  Privkey::GeneratePubkey((Pubkey *)&_Stack_1a8,(Privkey *)&local_178,true);
  Pubkey::GetFingerprint(&fingerprint,(Pubkey *)&_Stack_1a8,4);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_1a8);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_178);
  ExtPrivkey::GetExtPubkey(&local_178,&key);
  KeyData::KeyData(__return_storage_ptr__,&local_178,string_path,&fingerprint);
  ExtPubkey::~ExtPubkey(&local_178);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&fingerprint);
  ExtPrivkey::~ExtPrivkey(&key);
  ExtPrivkey::~ExtPrivkey(&privkey);
  return __return_storage_ptr__;
}

Assistant:

KeyData HDWallet::GeneratePubkeyData(
    NetType network_type, const std::string& string_path) const {
  ExtPrivkey privkey(seed_, network_type);
  ExtPrivkey key = privkey.DerivePrivkey(string_path);
  auto fingerprint = privkey.GetPrivkey().GeneratePubkey().GetFingerprint();
  return KeyData(key.GetExtPubkey(), string_path, fingerprint);
}